

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph.h
# Opt level: O3

void duckdb_je_edata_avail_insert(edata_avail_t *ph,edata_t *phn)

{
  edata_t *peVar1;
  edata_t *peVar2;
  edata_t *peVar3;
  edata_t *peVar4;
  long lVar5;
  uintptr_t b_eaddr;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  uintptr_t b_eaddr_1;
  bool bVar9;
  
  (phn->field_5).ql_link_active.qre_next = (edata_t *)0x0;
  (phn->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
  *(undefined8 *)((long)&phn->field_5 + 0x10) = 0;
  peVar1 = (edata_t *)(ph->ph).root;
  if (peVar1 == (edata_t *)0x0) {
    (ph->ph).root = phn;
    return;
  }
  uVar8 = (phn->field_2).e_size_esn & 0xfff;
  uVar6 = (peVar1->field_2).e_size_esn & 0xfff;
  if ((int)(((uint)(uVar6 < uVar8) - (uint)(uVar8 < uVar6)) * 2 - (uint)(phn < peVar1)) < 0) {
    *(edata_t **)((long)&phn->field_5 + 0x10) = peVar1;
    (peVar1->field_5).ql_link_active.qre_next = phn;
    (ph->ph).root = phn;
    (ph->ph).auxcount = 0;
  }
  else {
    peVar2 = (peVar1->field_5).ql_link_active.qre_prev;
    (phn->field_5).ql_link_active.qre_prev = peVar2;
    if (peVar2 != (edata_t *)0x0) {
      (peVar2->field_5).ql_link_active.qre_next = phn;
    }
    (phn->field_5).ql_link_active.qre_next = peVar1;
    (peVar1->field_5).ql_link_active.qre_prev = phn;
    uVar6 = (ph->ph).auxcount + 1;
    (ph->ph).auxcount = uVar6;
    lVar5 = 0;
    if (uVar6 != 0) {
      for (; (uVar6 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
      }
    }
    if (lVar5 != 0) {
      uVar7 = 1;
      while (peVar2 = (phn->field_5).ql_link_active.qre_prev, peVar2 != (edata_t *)0x0) {
        peVar3 = (peVar2->field_5).ql_link_active.qre_prev;
        (phn->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (phn->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        (peVar2->field_5).ql_link_active.qre_next = (edata_t *)0x0;
        (peVar2->field_5).ql_link_active.qre_prev = (edata_t *)0x0;
        uVar6 = (phn->field_2).e_size_esn & 0xfff;
        uVar8 = (peVar2->field_2).e_size_esn & 0xfff;
        if ((int)(((uint)(uVar8 < uVar6) - (uint)(uVar6 < uVar8)) * 2 - (uint)(phn < peVar2)) < 0) {
          (peVar2->field_5).ql_link_active.qre_next = phn;
          peVar4 = *(edata_t **)((long)&phn->field_5 + 0x10);
          (peVar2->field_5).ql_link_active.qre_prev = peVar4;
          if (peVar4 != (edata_t *)0x0) {
            (peVar4->field_5).ql_link_active.qre_next = peVar2;
          }
          *(edata_t **)((long)&phn->field_5 + 0x10) = peVar2;
        }
        else {
          (phn->field_5).ql_link_active.qre_next = peVar2;
          peVar4 = *(edata_t **)((long)&peVar2->field_5 + 0x10);
          (phn->field_5).ql_link_active.qre_prev = peVar4;
          if (peVar4 != (edata_t *)0x0) {
            (peVar4->field_5).ql_link_active.qre_next = phn;
          }
          *(edata_t **)((long)&peVar2->field_5 + 0x10) = phn;
          phn = peVar2;
        }
        (phn->field_5).ql_link_active.qre_prev = peVar3;
        if (peVar3 == (edata_t *)0x0) {
          (peVar1->field_5).ql_link_active.qre_prev = phn;
          (phn->field_5).ql_link_active.qre_next = peVar1;
          return;
        }
        (peVar3->field_5).ql_link_active.qre_next = phn;
        (peVar1->field_5).ql_link_active.qre_prev = phn;
        (phn->field_5).ql_link_active.qre_next = peVar1;
        if (peVar3 == (edata_t *)0x0) {
          return;
        }
        bVar9 = (uint)lVar5 <= uVar7;
        uVar7 = uVar7 + 1;
        if (bVar9) {
          return;
        }
      }
    }
  }
  return;
}

Assistant:

JEMALLOC_ALWAYS_INLINE void
phn_link_init(void *phn, size_t offset) {
	phn_link_get(phn, offset)->prev = NULL;
	phn_link_get(phn, offset)->next = NULL;
	phn_link_get(phn, offset)->lchild = NULL;
}